

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.h
# Opt level: O0

void gmath::div<double>(Polynomial<double> *p,Polynomial<double> *d,Polynomial<double> *q,
                       Polynomial<double> *r)

{
  int iVar1;
  Polynomial<double> *in_RCX;
  Polynomial<double> *in_RDX;
  Polynomial<double> *in_RSI;
  Polynomial<double> *in_RDI;
  int i_1;
  int i;
  int k;
  Polynomial<double> *in_stack_ffffffffffffff88;
  Polynomial<double> *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  Polynomial<double> *in_stack_ffffffffffffffa0;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  
  Polynomial<double>::init(in_RDX,(EVP_PKEY_CTX *)in_RSI);
  Polynomial<double>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  local_24 = Polynomial<double>::getDegree(in_RDI);
  iVar1 = Polynomial<double>::getDegree(in_RSI);
  for (local_24 = local_24 - iVar1; -1 < local_24; local_24 = local_24 + -1) {
    iVar1 = Polynomial<double>::getDegree(in_RSI);
    Polynomial<double>::operator[](in_RCX,iVar1 + local_24);
    iVar1 = Polynomial<double>::getDegree(in_RSI);
    Polynomial<double>::operator[](in_RSI,iVar1);
    Polynomial<double>::set
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(double)in_stack_ffffffffffffff90
              );
    local_28 = Polynomial<double>::getDegree(in_RSI);
    local_28 = local_28 + local_24;
    while (local_28 = local_28 + -1, local_24 <= local_28) {
      in_stack_ffffffffffffff90 = in_RCX;
      in_stack_ffffffffffffff9c = local_28;
      Polynomial<double>::operator[](in_RCX,local_28);
      in_stack_ffffffffffffffa0 =
           (Polynomial<double> *)Polynomial<double>::operator[](in_RDX,local_24);
      Polynomial<double>::operator[](in_RSI,local_28 - local_24);
      Polynomial<double>::set
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                 (double)in_stack_ffffffffffffff90);
    }
  }
  local_2c = Polynomial<double>::getDegree(in_RSI);
  while( true ) {
    iVar1 = Polynomial<double>::getDegree(in_RDI);
    if (iVar1 + 1 <= local_2c) break;
    Polynomial<double>::set
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(double)in_stack_ffffffffffffff90
              );
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void div(const Polynomial<T> &p, const Polynomial<T> &d,
                           Polynomial<T> &q, Polynomial<T> &r)
{
  // initialisation

  q.init();
  r=p;

  // perform division

  for (int k=p.getDegree()-d.getDegree(); k>=0; k--)
  {
    q.set(k, r[d.getDegree()+k]/d[d.getDegree()]);

    for (int i=d.getDegree()+k-1; i>=k; i--)
    {
      r.set(i, r[i]-q[k]*d[i-k]);
    }
  }

  // set leading coefficients of working array zero

  for (int i=d.getDegree(); i<p.getDegree()+1; i++)
  {
    r.set(i, 0);
  }
}